

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void save_stack_buffer(stCoRoutine_t *occupy_co)

{
  uint uVar1;
  char *pcVar2;
  int len;
  stStackMem_t *stack_mem;
  stCoRoutine_t *occupy_co_local;
  
  uVar1 = (int)occupy_co->stack_mem->stack_bp - (int)occupy_co->stack_sp;
  if (occupy_co->save_buffer != (char *)0x0) {
    free(occupy_co->save_buffer);
    occupy_co->save_buffer = (char *)0x0;
  }
  pcVar2 = (char *)malloc((long)(int)uVar1);
  occupy_co->save_buffer = pcVar2;
  occupy_co->save_size = uVar1;
  memcpy(occupy_co->save_buffer,occupy_co->stack_sp,(long)(int)uVar1);
  return;
}

Assistant:

void save_stack_buffer(stCoRoutine_t* occupy_co)
{
	///copy out
	stStackMem_t* stack_mem = occupy_co->stack_mem;
	int len = stack_mem->stack_bp - occupy_co->stack_sp;

	if (occupy_co->save_buffer)
	{
		free(occupy_co->save_buffer), occupy_co->save_buffer = NULL;
	}

	occupy_co->save_buffer = (char*)malloc(len); //malloc buf;
	occupy_co->save_size = len;

	memcpy(occupy_co->save_buffer, occupy_co->stack_sp, len);
}